

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-math.c
# Opt level: O0

int rtosc_arg_val_from_int(rtosc_arg_val_t *av,char type,int number)

{
  char cVar1;
  int number_local;
  char type_local;
  rtosc_arg_val_t *av_local;
  int local_4;
  
  av->type = type;
  switch(type) {
  case 'F':
  case 'T':
    (av->val).T = (double)number != 0.0;
    cVar1 = 'F';
    if ((av->val).T != '\0') {
      cVar1 = 'T';
    }
    av->type = cVar1;
    local_4 = 1;
    break;
  default:
    local_4 = 0;
    break;
  case 'c':
  case 'i':
    (av->val).i = number;
    local_4 = 1;
    break;
  case 'd':
    (av->val).d = (double)number;
    local_4 = 1;
    break;
  case 'f':
    (av->val).f = (float)number;
    local_4 = 1;
    break;
  case 'h':
    *(long *)&av->val = (long)number;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int rtosc_arg_val_from_int(rtosc_arg_val_t* av, char type, int number)
{
    av->type = type;
    switch(type)
    {
        case 'h': av->val.h = number; return true;
        case 'd': av->val.d = number; return true;
        case 'f': av->val.f = number; return true;
        case 'c':
        case 'i': av->val.i = number; return true;
        case 'F':
        case 'T':
            // note: we discard av->type here!
            //       it's clear that the decision should be based on "number",
            //       not on the current type
            av->val.T = (number != 0.0);
            av->type = av->val.T ? 'T' : 'F';
            return true;
        default: return false;
    }
}